

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O3

array<cv::RotatedRect,_10UL> *
ellipses::find_target(array<cv::RotatedRect,_10UL> *__return_storage_ptr__,Mat *img,bool debug)

{
  pointer pRVar1;
  pointer pfVar2;
  ulong uVar3;
  size_t ignored_index;
  ostream *poVar4;
  undefined7 in_register_00000011;
  RotatedRect *e;
  pointer this;
  pointer pRVar5;
  long lVar6;
  launch __policy;
  byte bVar7;
  array<cv::Mat,_5UL> *__return_storage_ptr___00;
  array<bool,_5UL> debug_contour;
  array<bool,_5UL> agregate_contour;
  vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> ellipses;
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  async_ellipse_process;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect> pair;
  Mat pretreat;
  array<cv::Mat,_5UL> filtered_images;
  Mat *local_3c8;
  undefined8 uStack_3c0;
  double adStack_3b8 [2];
  undefined4 local_3a4;
  char local_3a0 [8];
  bool local_398 [8];
  _InputArray local_390;
  vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> local_378;
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  local_358;
  Mat *local_338;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  array<cv::RotatedRect,_10UL> *local_328;
  int local_320;
  int local_31c;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_318;
  undefined1 local_2f8 [24];
  undefined1 auStack_2e0 [24];
  Size2f local_2c8;
  float local_2c0;
  undefined4 local_290 [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_288;
  undefined8 local_280;
  undefined8 local_278;
  Mat local_270 [96];
  array<cv::Mat,_5UL> local_210;
  
  local_3a4 = (undefined4)CONCAT71(in_register_00000011,debug);
  local_338 = img;
  local_328 = __return_storage_ptr__;
  pretreatment(local_270);
  __return_storage_ptr___00 = &local_210;
  filter_image(__return_storage_ptr___00,local_270);
  local_398[4] = false;
  local_398[0] = true;
  local_398[1] = true;
  local_398[2] = true;
  local_398[3] = true;
  local_3a0[4] = 0;
  local_3a0[0] = '\0';
  local_3a0[1] = '\0';
  local_3a0[2] = '\0';
  local_3a0[3] = '\0';
  local_358.
  super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
        *)0x0;
  local_358.
  super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
        *)0x0;
  local_358.
  super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ::reserve(&local_358,5);
  lVar6 = 0;
  do {
    __policy = (launch)(future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
                        *)local_2f8;
    if (local_3a0[lVar6] == '\x01') {
      local_3c8 = (Mat *)CONCAT71(local_3c8._1_7_,1);
      std::
      async<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>(&)(cv::Mat_const&,cv::Mat_const&,bool,bool),cv::Mat&,cv::Mat_const&,bool&,bool>
                (__policy,(_func_pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_Mat_ptr_Mat_ptr_bool_bool
                           *)0x2,(Mat *)detect_circle_approach,(Mat *)__return_storage_ptr___00,
                 (bool *)local_338,local_398 + lVar6);
      std::
      vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
      ::
      emplace_back<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>
                ((vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
                  *)&local_358,
                 (future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
                  *)local_2f8);
    }
    else {
      local_3c8 = (Mat *)((ulong)local_3c8._1_7_ << 8);
      std::
      async<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>(&)(cv::Mat_const&,cv::Mat_const&,bool,bool),cv::Mat&,cv::Mat_const&,bool&,bool>
                (__policy,(_func_pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_Mat_ptr_Mat_ptr_bool_bool
                           *)0x3,(Mat *)detect_circle_approach,(Mat *)__return_storage_ptr___00,
                 (bool *)local_338,local_398 + lVar6);
      std::
      vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
      ::
      emplace_back<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>
                ((vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
                  *)&local_358,
                 (future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
                  *)local_2f8);
    }
    if ((Size2f)local_2f8._8_8_ != (Size2f)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_);
    }
    lVar6 = lVar6 + 1;
    __return_storage_ptr___00 = (array<cv::Mat,_5UL> *)&__return_storage_ptr___00->field_0x60;
  } while (lVar6 != 3);
  local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
  super__Vector_impl_data._M_start = (RotatedRect *)0x0;
  local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (RotatedRect *)0x0;
  local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::reserve
            (&local_378,
             (long)local_358.
                   super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_358.
                   super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::reserve(&local_318,
            (long)local_358.
                  super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_358.
                  super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
  pfVar2 = local_358.
           super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_358.
      super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_358.
      super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this = local_358.
           super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
      ::get((pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>
             *)local_2f8,this);
      if (local_2f8._8_8_ != local_2f8._0_8_) {
        std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::
        emplace_back<cv::RotatedRect>(&local_378,(RotatedRect *)auStack_2e0);
        std::
        vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
        ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                  ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                    *)&local_318,
                   (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_2f8);
      }
      if ((Size2f)local_2f8._0_8_ != (Size2f)0x0) {
        operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
      }
      this = this + 1;
    } while (this != pfVar2);
  }
  if ((char)local_3a4 != '\0') {
    cv::Mat::clone();
    local_390.sz.width = 0;
    local_390.sz.height = 0;
    local_390.flags = 0x3010000;
    local_280 = 0;
    local_290[0] = 0x8104000c;
    local_288 = &local_318;
    local_3c8 = (Mat *)0x406fe00000000000;
    uStack_3c0 = 0;
    adStack_3b8[0] = 0.0;
    adStack_3b8[1] = 0.0;
    local_390.obj = local_2f8;
    uVar3 = cv::noArray();
    local_278 = 0;
    cv::drawContours(&local_390,local_290,0xffffffff,&local_3c8,3,8,uVar3,0x7fffffff,&local_278);
    pRVar1 = local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar7 = 0x20;
      local_338 = (Mat *)0x0;
      uStack_330 = 0;
      uStack_32c = 0x406fe000;
      pRVar5 = local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        local_390.sz.width = 0;
        local_390.sz.height = 0;
        local_390.flags = 0x3010000;
        local_320 = (int)ROUND((pRVar5->center).x);
        local_31c = (int)ROUND((pRVar5->center).y);
        adStack_3b8[0] = (double)bVar7;
        local_3c8 = (Mat *)0x0;
        uStack_3c0 = 0;
        adStack_3b8[1] = 0.0;
        uVar3 = uVar3 & 0xffffffff00000000;
        local_390.obj = local_2f8;
        cv::circle(&local_390,&local_320,10,(Scalar_ *)&local_3c8,6,8,uVar3);
        local_390.sz.width = 0;
        local_390.sz.height = 0;
        local_390.flags = 0x3010000;
        uStack_3c0 = CONCAT44(uStack_32c,uStack_330);
        local_3c8 = local_338;
        adStack_3b8[0] = 0.0;
        adStack_3b8[1] = 0.0;
        local_390.obj = local_2f8;
        cv::ellipse((_InputOutputArray *)&local_390,pRVar5,(Scalar_ *)&local_3c8,3,8);
        bVar7 = bVar7 + 0x20;
        pRVar5 = pRVar5 + 1;
      } while (pRVar5 != pRVar1);
    }
    local_3c8 = (Mat *)adStack_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Output","");
    cv::namedWindow((string *)&local_3c8,0);
    if (local_3c8 != (Mat *)adStack_3b8) {
      operator_delete(local_3c8,(long)adStack_3b8[0] + 1);
    }
    local_3c8 = (Mat *)adStack_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Output","");
    local_390.sz.width = 0;
    local_390.sz.height = 0;
    local_390.flags = 0x1010000;
    local_390.obj = local_2f8;
    cv::imshow((string *)&local_3c8,&local_390);
    if (local_3c8 != (Mat *)adStack_3b8) {
      operator_delete(local_3c8,(long)adStack_3b8[0] + 1);
    }
    cv::waitKey(0);
    cv::destroyAllWindows();
    cv::Mat::~Mat((Mat *)local_2f8);
  }
  ignored_index = find_weakest_element(&local_378);
  if ((char)local_3a4 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"weakest ",8);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_2f8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2f8,1);
  }
  local_2f8._0_8_ =
       (local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
        super__Vector_impl_data._M_start)->center;
  local_2f8._8_8_ =
       (local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
        super__Vector_impl_data._M_start)->size;
  local_2f8._16_8_ =
       *(undefined8 *)
        &(local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
          super__Vector_impl_data._M_start)->angle;
  auStack_2e0._0_8_ =
       *(undefined8 *)
        &local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
         super__Vector_impl_data._M_start[1].center.y;
  auStack_2e0._8_8_ =
       *(undefined8 *)
        &local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
         super__Vector_impl_data._M_start[1].size.height;
  auStack_2e0._16_8_ =
       local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
       super__Vector_impl_data._M_start[2].center;
  local_2c8 = local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>.
              _M_impl.super__Vector_impl_data._M_start[2].size;
  local_2c0 = local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>.
              _M_impl.super__Vector_impl_data._M_start[2].angle;
  compute_final_ellipses_by_linear_interpolation
            (local_328,(array<cv::RotatedRect,_3UL> *)local_2f8,ignored_index);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_318);
  if (local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>._M_impl.
      super__Vector_impl_data._M_start != (RotatedRect *)0x0) {
    operator_delete(local_378.super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_378.
                          super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.
                          super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ::~vector(&local_358);
  lVar6 = 0x180;
  do {
    cv::Mat::~Mat((Mat *)(&local_210.field_0x0 + lVar6));
    lVar6 = lVar6 + -0x60;
  } while (lVar6 != -0x60);
  cv::Mat::~Mat(local_270);
  return local_328;
}

Assistant:

std::array<cv::RotatedRect, 10> find_target(const cv::Mat& img, bool debug)
{
    cv::Mat pretreat = pretreatment(img);
    std::array<cv::Mat, 5> filtered_images = filter_image(pretreat);
    std::array<bool, 5> agregate_contour {true, true, true, true, false};
    std::array<bool, 5> debug_contour {false, false, false, false, false};

    std::vector<std::future<std::pair<std::vector<cv::Point>, cv::RotatedRect>>> async_ellipse_process;
    async_ellipse_process.reserve(filtered_images.size());
    for(std::size_t i = 0; i < 3; i++)
    {
        if(debug_contour[i])
        {
            async_ellipse_process.emplace_back(std::async(
                std::launch::deferred, detect_circle_approach, filtered_images[i], img, agregate_contour[i], true));
        }
        else
        {
            async_ellipse_process.emplace_back(
                std::async(detect_circle_approach, filtered_images[i], img, agregate_contour[i], false));
        }
    }

    std::vector<cv::RotatedRect> ellipses;
    std::vector<std::vector<cv::Point>> contours;
    ellipses.reserve(async_ellipse_process.size());
    contours.reserve(async_ellipse_process.size());
    for(auto& async_p : async_ellipse_process)
    {
        auto pair = async_p.get();
        if(pair.first.size())
        {
            ellipses.emplace_back(std::move(pair.second));
            contours.emplace_back(std::move(pair.first));
        }
    }

    if(debug)
    {
        auto tmp = img.clone();
        cv::drawContours(tmp, contours, -1, cv::Scalar(255, 0, 0), 3);
        unsigned char shade = 32;
        for(const auto& e : ellipses)
        {
            cv::circle(tmp, e.center, 10, cv::Scalar(0, 0, shade), 6);
            cv::ellipse(tmp, e, cv::Scalar(0, 255, 0), 3);
            shade += 32;
        }

        cv::namedWindow("Output", cv::WINDOW_NORMAL);
        cv::imshow("Output", tmp);
        cv::waitKey(0);
        cv::destroyAllWindows();
    }

    auto value = find_weakest_element(ellipses);

    if(debug)
    {
        std::cout << "weakest " << value << '\n';
    }

    return compute_final_ellipses_by_linear_interpolation({ellipses[0], ellipses[1], ellipses[2]}, value);
}